

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setFocusWidget(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  WindowStates WVar2;
  FocusPolicy FVar3;
  code *UNRECOVERED_JUMPTABLE;
  QWidget *this_01;
  undefined8 uVar4;
  QWidget *this_02;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->baseWidget);
  if (bVar1) {
    if (this->focusInReason == BacktabFocusReason) {
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this_00 + 0x198);
      uVar4 = 0;
LAB_00416dc4:
      (*UNRECOVERED_JUMPTABLE)(this_00,uVar4);
      return;
    }
    if (this->focusInReason == TabFocusReason) {
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this_00 + 0x198);
      uVar4 = 1;
      goto LAB_00416dc4;
    }
    WVar2 = QWidget::windowState(this_00);
    if ((((uint)WVar2.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                super_QFlagsStorage<Qt::WindowState>.i & 1) == 0) &&
       (bVar1 = restoreFocus(this), bVar1)) {
      return;
    }
    this_01 = QWidget::focusWidget((QWidget *)(this->baseWidget).wp.value);
    this_02 = this_00;
    if (this_01 == (QWidget *)0x0) {
      do {
        this_01 = QWidget::nextInFocusChain(this_02);
        if ((this_01 == (QWidget *)0x0) || (this_01 == this_00)) {
          if (this_01 == (QWidget *)0x0) goto LAB_00416e95;
          break;
        }
        FVar3 = QWidget::focusPolicy(this_01);
        this_02 = this_01;
      } while (FVar3 == NoFocus);
      bVar1 = QWidget::isAncestorOf(this_00,this_01);
      if (bVar1) goto LAB_00416ed5;
LAB_00416e95:
      FVar3 = QWidget::focusPolicy((QWidget *)(this->baseWidget).wp.value);
      if (FVar3 != NoFocus) {
        this_01 = (QWidget *)(this->baseWidget).wp.value;
        goto LAB_00416ed5;
      }
      bVar1 = QWidget::hasFocus(this_00);
      if (bVar1) {
        return;
      }
    }
    else {
      bVar1 = QWidget::hasFocus(this_01);
      if ((((!bVar1) && (bVar1 = QWidget::isAncestorOf(this_00,this_01), bVar1)) &&
          ((this_01->data->widget_attributes & 0x8000) != 0)) &&
         ((bVar1 = QWidget::isMinimized(this_00), !bVar1 &&
          (FVar3 = QWidget::focusPolicy(this_01), FVar3 != NoFocus)))) goto LAB_00416ed5;
    }
  }
  this_01 = this_00;
LAB_00416ed5:
  QWidget::setFocus(this_01);
  return;
}

Assistant:

void QMdiSubWindowPrivate::setFocusWidget()
{
    Q_Q(QMdiSubWindow);
    if (!baseWidget) {
        q->setFocus();
        return;
    }

    // This will give focus to the next child if possible, otherwise
    // do nothing, hence it's not possible to tab between windows with
    // just hitting tab (unless Qt::TabFocus is removed from the focus policy).
    if (focusInReason == Qt::TabFocusReason) {
        q->focusNextChild();
        return;
    }

    // Same as above, but gives focus to the previous child.
    if (focusInReason == Qt::BacktabFocusReason) {
        q->focusPreviousChild();
        return;
    }

    if (!(q->windowState() & Qt::WindowMinimized) && restoreFocus())
        return;

    if (QWidget *focusWidget = baseWidget->focusWidget()) {
        if (!focusWidget->hasFocus() && q->isAncestorOf(focusWidget)
                && focusWidget->isVisible() && !q->isMinimized()
                && focusWidget->focusPolicy() != Qt::NoFocus) {
            focusWidget->setFocus();
        } else {
            q->setFocus();
        }
        return;
    }

    QWidget *focusWidget = q->nextInFocusChain();
    while (focusWidget && focusWidget != q && focusWidget->focusPolicy() == Qt::NoFocus)
        focusWidget = focusWidget->nextInFocusChain();
    if (focusWidget && q->isAncestorOf(focusWidget))
        focusWidget->setFocus();
    else if (baseWidget->focusPolicy() != Qt::NoFocus)
        baseWidget->setFocus();
    else if (!q->hasFocus())
        q->setFocus();
}